

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O2

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  FT_Byte *pFVar5;
  ulong uVar6;
  FT_Offset new_count;
  ulong uVar7;
  FT_ULong *pFVar8;
  long lVar9;
  uint uVar10;
  FT_Memory pFVar11;
  ulong uVar12;
  ulong uVar13;
  FT_Byte **ppFVar14;
  FT_Byte *pFVar15;
  ulong new_count_00;
  char cVar16;
  ulong uVar17;
  FT_Error error;
  FT_Memory local_78;
  uint local_6c;
  FT_Byte **local_68;
  FT_Byte *local_60;
  ulong local_58;
  uint local_4c;
  FT_Offset local_48;
  byte *local_40;
  FT_ULong real_size;
  
  pbVar2 = (loader->parser).root.limit;
  pFVar11 = (loader->parser).root.memory;
  local_68 = &face->ttf_data;
  ft_mem_free(pFVar11,face->ttf_data);
  face->ttf_data = (FT_Byte *)0x0;
  face->ttf_size = 0;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar3 = (loader->parser).root.cursor;
  if ((pbVar3 < pbVar2) && ((loader->parser).root.cursor = pbVar3 + 1, *pbVar3 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    uVar13 = 0xc;
    pFVar5 = (FT_Byte *)ft_mem_qalloc(pFVar11,0xc,&error);
    *local_68 = pFVar5;
    uVar7 = 0;
    if (error == 0) {
      pFVar5 = (FT_Byte *)0x0;
      uVar12 = 0;
      local_48 = 0;
      pFVar15 = (FT_Byte *)0x0;
      local_4c = 0;
      uVar6 = 0;
      local_78 = pFVar11;
      local_40 = pbVar2;
      while (pFVar11 = local_78, pbVar2 = (loader->parser).root.cursor, ppFVar14 = local_68,
            pbVar2 < local_40) {
        bVar1 = *pbVar2;
        if (bVar1 != 0x3c) {
          if (bVar1 == 0x5d) {
            (loader->parser).root.cursor = pbVar2 + 1;
            face->ttf_size = (FT_Long)pFVar15;
            iVar4 = (loader->parser).root.error;
            goto LAB_002241dc;
          }
          new_count = local_48;
          if (9 < bVar1 - 0x30) goto LAB_002243ac;
          if ((char)uVar12 == '\0') {
            local_60 = pFVar15;
            local_58 = uVar7;
            uVar6 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
            if ((long)uVar6 < 0) goto LAB_002241d0;
            (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
            if ((loader->parser).root.error != 0) {
              return;
            }
            pFVar15 = (loader->parser).root.cursor;
            pFVar5 = pFVar15 + 1;
            if (uVar6 < (ulong)((long)local_40 - (long)pFVar15)) {
              (loader->parser).root.cursor = pFVar15 + uVar6 + 1;
              uVar12 = 0;
              uVar7 = local_58;
              pFVar15 = local_60;
              goto LAB_002243c0;
            }
            error = 3;
            goto LAB_002241bd;
          }
LAB_0022459e:
          error = 3;
          ppFVar14 = local_68;
          goto LAB_002241d8;
        }
        if ((char)uVar12 == '\0' && pFVar5 != (FT_Byte *)0x0) {
          uVar12 = 0;
          break;
        }
        local_60 = pFVar15;
        local_58 = uVar7;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        pFVar11 = local_78;
        ppFVar14 = local_68;
        if ((loader->parser).root.error != 0) goto LAB_002241e0;
        pFVar15 = (loader->parser).root.cursor;
        new_count = (long)(pFVar15 + ~(ulong)pbVar2) / 2;
        if ((ulong)((long)pFVar15 - (long)pbVar2) < 3) {
          error = 3;
          goto LAB_002241d8;
        }
        local_6c = (uint)uVar12;
        pFVar5 = (FT_Byte *)ft_mem_qrealloc(local_78,1,local_48,new_count,pFVar5,&error);
        ppFVar14 = local_68;
        if (error != 0) {
LAB_00224575:
          uVar12 = (ulong)local_6c;
          pFVar11 = local_78;
          goto LAB_002241d8;
        }
        (loader->parser).root.cursor = pbVar2;
        pFVar8 = &real_size;
        (*(loader->parser).root.funcs.to_bytes)((PS_Parser)loader,pFVar5,new_count,pFVar8,'\x01');
        uVar12 = CONCAT71((int7)((ulong)pFVar8 >> 8),1);
        uVar6 = real_size;
        uVar7 = local_58;
        pFVar15 = local_60;
LAB_002243ac:
        pFVar11 = local_78;
        if (pFVar5 == (FT_Byte *)0x0) {
          error = 3;
          pFVar5 = (FT_Byte *)0x0;
          uVar12 = uVar12 & 0xffffffff;
          ppFVar14 = local_68;
          goto LAB_002241d8;
        }
        uVar12 = uVar12 & 0xffffffff;
        local_48 = new_count;
LAB_002243c0:
        if ((uVar6 & 1) == 0) {
LAB_002243d0:
          if (uVar6 == 0) goto LAB_0022459e;
        }
        else if (pFVar5[uVar6 - 1] == '\0') {
          uVar6 = uVar6 - 1;
          goto LAB_002243d0;
        }
        local_6c = (uint)uVar12;
        uVar17 = (long)local_40 - (long)(loader->parser).root.cursor;
        ppFVar14 = local_68;
        local_60 = pFVar5;
        local_58 = uVar6;
        for (uVar12 = 0; uVar12 != uVar6; uVar12 = uVar12 + 1) {
          if ((int)uVar7 == 2) {
LAB_00224518:
            uVar7 = 2;
            if ((long)uVar13 <= (long)pFVar15) {
              error = 3;
              goto LAB_00224575;
            }
          }
          else {
            new_count_00 = uVar13;
            if ((int)uVar7 == 1) {
LAB_0022447a:
              if ((long)new_count_00 <= (long)pFVar15) {
                uVar7 = 0;
                if (0 < (int)local_4c) {
                  uVar7 = (ulong)local_4c;
                }
                uVar13 = new_count_00;
                for (lVar9 = 0; uVar7 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
                  uVar10 = *(uint *)(*ppFVar14 + lVar9 + 0x18);
                  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                           uVar10 << 0x18;
                  if ((uVar17 < uVar10) || ((long)(uVar17 - uVar10) < (long)uVar13))
                  goto LAB_00224560;
                  uVar13 = uVar13 + (uVar10 + 3 & 0xfffffffc);
                }
                uVar13 = uVar13 + 1;
                pFVar5 = (FT_Byte *)ft_mem_qrealloc(local_78,1,new_count_00,uVar13,*ppFVar14,&error)
                ;
                *local_68 = pFVar5;
                uVar6 = local_58;
                ppFVar14 = local_68;
                pFVar5 = local_60;
                if (error == 0) goto LAB_00224518;
                goto LAB_00224575;
              }
              uVar7 = 1;
              uVar13 = new_count_00;
              pFVar5 = local_60;
            }
            else {
              uVar7 = 0;
              if (0xb < (long)pFVar15) {
                pFVar5 = *ppFVar14;
                local_4c = (uint)pFVar5[5] + (uint)pFVar5[4] * 0x10;
                new_count_00 = (ulong)(local_4c * 0x10 | 0xc);
                if ((long)uVar17 < (long)new_count_00) {
LAB_00224560:
                  error = 3;
                  pFVar5 = local_60;
                }
                else {
                  pFVar5 = (FT_Byte *)ft_mem_qrealloc(local_78,1,uVar13,new_count_00,pFVar5,&error);
                  *local_68 = pFVar5;
                  uVar6 = local_58;
                  ppFVar14 = local_68;
                  pFVar5 = local_60;
                  if (error == 0) goto LAB_0022447a;
                }
                goto LAB_00224575;
              }
            }
          }
          (*ppFVar14)[(long)pFVar15] = pFVar5[uVar12];
          pFVar15 = pFVar15 + 1;
        }
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
        uVar12 = (ulong)local_6c;
        uVar6 = local_58;
      }
      error = 3;
    }
    else {
      pFVar5 = (FT_Byte *)0x0;
LAB_002241bd:
      uVar12 = 0;
      ppFVar14 = local_68;
    }
  }
  else {
    pFVar5 = (FT_Byte *)0x0;
LAB_002241d0:
    error = 3;
    uVar12 = 0;
    ppFVar14 = local_68;
  }
LAB_002241d8:
  (loader->parser).root.error = error;
  iVar4 = error;
LAB_002241dc:
  cVar16 = (char)uVar12;
  if (iVar4 != 0) {
LAB_002241e0:
    cVar16 = (char)uVar12;
    ft_mem_free(pFVar11,*ppFVar14);
    *ppFVar14 = (FT_Byte *)0x0;
    ppFVar14[1] = (FT_Byte *)0x0;
  }
  if (cVar16 != '\0') {
    ft_mem_free(pFVar11,pFVar5);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     ttf_count;
    FT_Long     ttf_reserved;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;

    /** There should only be one sfnts array, but free any previous. */
    FT_FREE( face->ttf_data );
    face->ttf_size = 0;

    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    ttf_count       = 0;
    ttf_reserved    = 12;
    if ( FT_QALLOC( face->ttf_data, ttf_reserved ) )
      goto Fail;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "t42_parse_sfnts:\n" ));

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        face->ttf_size = ttf_count;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        if ( string_buf && !allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_QREALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      FT_TRACE2(( "  PS string size %5lu bytes, offset 0x%08lx (%lu)\n",
                  string_size, ttf_count, ttf_count ));

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( ttf_count < 12 )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            FT_Long ttf_reserved_prev = ttf_reserved;


            num_tables   = 16 * face->ttf_data[4] + face->ttf_data[5];
            status       = BEFORE_TABLE_DIR;
            ttf_reserved = 12 + 16 * num_tables;

            FT_TRACE2(( "  SFNT directory contains %d tables\n",
                        num_tables ));

            if ( (FT_Long)size < ttf_reserved )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( ttf_count < ttf_reserved )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;
            FT_Long ttf_reserved_prev = ttf_reserved;


            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  table    length\n" ));
            FT_TRACE2(( "  ------------------------------\n" ));

            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              FT_TRACE2(( "   %4i  0x%08lx (%lu)\n", i, len, len ));

              if ( len > size                               ||
                   ttf_reserved > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              ttf_reserved += (FT_Long)( ( len + 3 ) & ~3U );
            }
            ttf_reserved += 1;

            status = OTHER_TABLES;

            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  allocating %ld bytes\n", ttf_reserved ));
            FT_TRACE2(( "\n" ));

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( ttf_count >= ttf_reserved )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[ttf_count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( parser->root.error )
    {
      FT_FREE( face->ttf_data );
      face->ttf_size = 0;
    }
    if ( allocated )
      FT_FREE( string_buf );
  }